

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<std::array<unsigned_int,2ul>>
          (Attribute *this,array<unsigned_int,_2UL> *v)

{
  value_type *pvVar1;
  optional<std::array<unsigned_int,_2UL>_> ret;
  optional<std::array<unsigned_int,_2UL>_> local_30;
  optional<std::array<unsigned_int,_2UL>_> local_24;
  
  if (v == (array<unsigned_int,_2UL> *)0x0) {
    local_30.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::array<unsigned_int,2ul>>(&local_30,&this->_var);
    local_24.has_value_ = local_30.has_value_;
    if (local_30.has_value_ != false) {
      local_24.contained = local_30.contained;
      pvVar1 = nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::value(&local_24);
      *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar1->_M_elems;
    }
  }
  return local_30.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }